

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetMassEpsLin(void *arkode_mem,realtype eplifac)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = eplifac;
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSSetMassEpsLin",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->eplifac =
         (realtype)
         (~-(ulong)(local_18 <= 0.0) & (ulong)local_18 |
         -(ulong)(local_18 <= 0.0) & 0x3fa999999999999a);
  }
  return iVar1;
}

Assistant:

int arkLSSetMassEpsLin(void *arkode_mem, realtype eplifac)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; store input and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassEpsLin",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return(ARKLS_SUCCESS);
}